

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

VkDescriptorSetLayout * __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::createMSPassDescSetLayout
          (MSInstanceSampleMaskPattern *this,ImageMSParams *imageMSParams)

{
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *this_00;
  Move<vk::Handle<(vk::HandleType)19>_> *this_01;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_a8;
  deUint64 local_88;
  DeviceInterface *pDStack_80;
  VkDevice local_78;
  VkAllocationCallbacks *pVStack_70;
  DescriptorSetLayoutBuilder local_68;
  
  vk = Context::getDeviceInterface
                 ((this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase
                  .super_TestInstance.m_context);
  device = Context::getDevice((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                              super_MultisampleInstanceBase.super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_68);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_68,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x10);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_a8,this_00,vk,device,0);
  local_78 = local_a8.m_data.deleter.m_device;
  pVStack_70 = local_a8.m_data.deleter.m_allocator;
  local_88 = local_a8.m_data.object.m_internal;
  pDStack_80 = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_01 = &this->m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_78;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = pVStack_70;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal = local_88;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = pDStack_80;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_a8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_68);
  return (VkDescriptorSetLayout *)this_01;
}

Assistant:

const VkDescriptorSetLayout* MSInstanceSampleMaskPattern::createMSPassDescSetLayout (const ImageMSParams& imageMSParams)
{
	DE_UNREF(imageMSParams);

	const DeviceInterface&		deviceInterface = m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();

	// Create descriptor set layout
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_FRAGMENT_BIT)
		.build(deviceInterface, device);

	return &m_descriptorSetLayout.get();
}